

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall testing::Matcher<wchar_t>::Matcher(Matcher<wchar_t> *this,wchar_t value)

{
  EqMatcher<wchar_t> EVar1;
  Matcher<wchar_t> *in_RDI;
  undefined4 in_stack_ffffffffffffffc4;
  EqMatcher<wchar_t> *in_stack_ffffffffffffffe8;
  
  internal::MatcherBase<wchar_t>::MatcherBase((MatcherBase<wchar_t> *)0x1274cb);
  (in_RDI->super_MatcherBase<wchar_t>)._vptr_MatcherBase = (_func_int **)&PTR__Matcher_00268990;
  EVar1 = Eq<wchar_t>(L'\x001274e2');
  internal::EqMatcher::operator_cast_to_Matcher(in_stack_ffffffffffffffe8);
  operator=((Matcher<wchar_t> *)CONCAT44(in_stack_ffffffffffffffc4,EVar1.rhs_),in_RDI);
  ~Matcher((Matcher<wchar_t> *)0x12751b);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }